

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_utils.c
# Opt level: O1

int WebPSetWorkerInterface(WebPWorkerInterface *winterface)

{
  int iVar1;
  
  iVar1 = 0;
  if ((((winterface != (WebPWorkerInterface *)0x0) &&
       (winterface->Init != (_func_void_WebPWorker_ptr *)0x0)) &&
      (winterface->Reset != (_func_int_WebPWorker_ptr *)0x0)) &&
     (((winterface->Sync != (_func_int_WebPWorker_ptr *)0x0 &&
       (winterface->Launch != (_func_void_WebPWorker_ptr *)0x0)) &&
      ((winterface->Execute != (_func_void_WebPWorker_ptr *)0x0 &&
       (winterface->End != (_func_void_WebPWorker_ptr *)0x0)))))) {
    g_worker_interface.Init = winterface->Init;
    g_worker_interface.Reset = winterface->Reset;
    g_worker_interface.Sync = winterface->Sync;
    g_worker_interface.Launch = winterface->Launch;
    g_worker_interface.Execute = winterface->Execute;
    g_worker_interface.End = winterface->End;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int WebPSetWorkerInterface(const WebPWorkerInterface* const winterface) {
  if (winterface == NULL ||
      winterface->Init == NULL || winterface->Reset == NULL ||
      winterface->Sync == NULL || winterface->Launch == NULL ||
      winterface->Execute == NULL || winterface->End == NULL) {
    return 0;
  }
  g_worker_interface = *winterface;
  return 1;
}